

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O3

double * MatMul(double *A,int Arow,int Acol,double *B,int Brow,int Bcol)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  
  uVar1 = (ulong)(uint)Bcol;
  pdVar2 = (double *)malloc((long)Bcol * (long)Arow * 8);
  if (Acol == Brow) {
    if (0 < Arow) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        if (0 < Bcol) {
          uVar6 = 0;
          pdVar7 = B;
          do {
            pdVar2[uVar4 * uVar1 + uVar6] = 0.0;
            if (0 < Acol) {
              dVar9 = 0.0;
              uVar8 = 0;
              pdVar5 = pdVar7;
              do {
                dVar9 = dVar9 + A[uVar3 + uVar8] * *pdVar5;
                uVar8 = uVar8 + 1;
                pdVar5 = pdVar5 + uVar1;
              } while ((uint)Acol != uVar8);
              pdVar2[uVar4 * uVar1 + uVar6] = dVar9;
            }
            uVar6 = uVar6 + 1;
            pdVar7 = pdVar7 + 1;
          } while (uVar6 != uVar1);
        }
        uVar4 = uVar4 + 1;
        uVar3 = (ulong)(uint)((int)uVar3 + Acol);
      } while (uVar4 != (uint)Arow);
    }
  }
  else {
    puts(&DAT_00108707);
    pdVar2 = (double *)0x0;
  }
  return pdVar2;
}

Assistant:

double *MatMul(double *A, int Arow, int Acol, double *B, int Brow, int Bcol) {
    double *Out = (double *) malloc(sizeof(double) * Arow * Bcol);
    if (Acol != Brow) {
        printf("        Shit!矩阵不可乘!\n");
        return NULL;
    }
    if (Acol == Brow) {
        int i, j, k;
        for (i = 0; i < Arow; i++)
            for (j = 0; j < Bcol; j++) {
                Out[Bcol * i + j] = 0;
                for (k = 0; k < Acol; k++)
                    Out[Bcol * i + j] = Out[Bcol * i + j] + A[Acol * i + k] * B[Bcol * k + j];
            }
        return Out;
    }
}